

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
             *this,double *blockB,const_blas_data_mapper<double,_long,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long k_1;
  long j2_1;
  LinearMapper dm0;
  long k;
  long j2;
  long count;
  long packet_cols4;
  long packet_cols8;
  conj_if<false> cj;
  long local_118;
  long local_110;
  double *local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  undefined8 local_e0;
  conj_if<false> local_d1;
  long local_d0;
  long local_c8;
  long local_c0;
  long *local_b8;
  long local_b0;
  undefined8 local_a0;
  double **local_98;
  undefined8 local_90;
  double **local_88;
  undefined8 local_80;
  double **local_78;
  undefined8 local_70;
  double **local_68;
  long local_60;
  long local_58;
  long *local_50;
  long local_48;
  long local_40;
  long *local_38;
  undefined1 local_30 [8];
  double *local_28;
  undefined1 *local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  local_d0 = in_R9;
  local_c8 = in_R8;
  local_c0 = in_RCX;
  local_b8 = in_RDX;
  local_b0 = in_RSI;
  ignore_unused_variable<long>(&local_d0);
  ignore_unused_variable<long>(&stack0x00000008);
  if ((local_d0 != 0) || (bVar1 = true, in_stack_00000008 != 0)) {
    bVar1 = false;
  }
  if (!bVar1) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x7f5,
                  "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = false]"
                 );
  }
  local_e0 = 0;
  local_e8 = local_c8 / 4 << 2;
  local_f0 = 0;
  for (local_f8 = 0; local_f8 < local_e8; local_f8 = local_f8 + 4) {
    for (local_100 = 0; local_100 < local_c0; local_100 = local_100 + 1) {
      local_38 = local_b8;
      local_40 = local_100;
      local_48 = local_f8;
      local_8 = local_b8;
      local_10 = local_100;
      local_18 = local_f8;
      local_108 = (double *)(*local_b8 + (local_f8 + local_100 * local_b8[1]) * 8);
      local_20 = local_30;
      local_68 = &local_108;
      local_70 = 0;
      local_28 = local_108;
      pdVar2 = conj_if<false>::operator()(&local_d1,local_108);
      *(double *)(local_b0 + local_f0 * 8) = *pdVar2;
      local_78 = &local_108;
      local_80 = 1;
      pdVar2 = conj_if<false>::operator()(&local_d1,local_108 + 1);
      *(double *)(local_b0 + 8 + local_f0 * 8) = *pdVar2;
      local_88 = &local_108;
      local_90 = 2;
      pdVar2 = conj_if<false>::operator()(&local_d1,local_108 + 2);
      *(double *)(local_b0 + 0x10 + local_f0 * 8) = *pdVar2;
      local_98 = &local_108;
      local_a0 = 3;
      pdVar2 = conj_if<false>::operator()(&local_d1,local_108 + 3);
      *(double *)(local_b0 + 0x18 + local_f0 * 8) = *pdVar2;
      local_f0 = local_f0 + 4;
    }
  }
  for (local_110 = local_e8; local_110 < local_c8; local_110 = local_110 + 1) {
    for (local_118 = 0; local_118 < local_c0; local_118 = local_118 + 1) {
      local_50 = local_b8;
      local_58 = local_118;
      local_60 = local_110;
      pdVar2 = conj_if<false>::operator()
                         (&local_d1,
                          (double *)(*local_b8 + (local_110 + local_118 * local_b8[1]) * 8));
      *(double *)(local_b0 + local_f0 * 8) = *pdVar2;
      local_f0 = local_f0 + 1;
    }
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;

//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       for(Index k=0; k<depth; k++)
//       {
//         if (PacketSize==8) {
//           Packet A = ploadu<Packet>(&rhs[k*rhsStride + j2]);
//           pstoreu(blockB+count, cj.pconj(A));
//         } else if (PacketSize==4) {
//           Packet A = ploadu<Packet>(&rhs[k*rhsStride + j2]);
//           Packet B = ploadu<Packet>(&rhs[k*rhsStride + j2 + PacketSize]);
//           pstoreu(blockB+count, cj.pconj(A));
//           pstoreu(blockB+count+PacketSize, cj.pconj(B));
//         } else {
//           const Scalar* b0 = &rhs[k*rhsStride + j2];
//           blockB[count+0] = cj(b0[0]);
//           blockB[count+1] = cj(b0[1]);
//           blockB[count+2] = cj(b0[2]);
//           blockB[count+3] = cj(b0[3]);
//           blockB[count+4] = cj(b0[4]);
//           blockB[count+5] = cj(b0[5]);
//           blockB[count+6] = cj(b0[6]);
//           blockB[count+7] = cj(b0[7]);
//         }
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }
  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      for(Index k=0; k<depth; k++)
      {
        if (PacketSize==4) {
          Packet A = rhs.loadPacket(k, j2);
          pstoreu(blockB+count, cj.pconj(A));
          count += PacketSize;
        } else {
          const LinearMapper dm0 = rhs.getLinearMapper(k, j2);
          blockB[count+0] = cj(dm0(0));
          blockB[count+1] = cj(dm0(1));
          blockB[count+2] = cj(dm0(2));
          blockB[count+3] = cj(dm0(3));
          count += 4;
        }
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(rhs(k, j2));
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}